

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

int If_DsdObjCreate(If_DsdMan_t *p,int Type,int *pLits,int nLits,int truthId)

{
  int iVar1;
  uint uVar2;
  If_DsdObj_t *pIVar3;
  int local_40;
  int local_3c;
  int iPrev;
  int i;
  If_DsdObj_t *pFanin;
  If_DsdObj_t *pObj;
  int truthId_local;
  int nLits_local;
  int *pLits_local;
  int Type_local;
  If_DsdMan_t *p_local;
  
  local_40 = -1;
  if ((Type == 5) && (nLits != 3)) {
    __assert_fail("Type != DAU_DSD_MUX || nLits == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x3c3,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
  }
  if (((Type == 5) && (iVar1 = Abc_LitIsCompl(pLits[1]), iVar1 != 0)) &&
     (iVar1 = Abc_LitIsCompl(pLits[2]), iVar1 != 0)) {
    __assert_fail("Type != DAU_DSD_MUX || !Abc_LitIsCompl(pLits[1]) || !Abc_LitIsCompl(pLits[2])",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x3c5,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
  }
  if ((Type == 3) || (Type == 4)) {
    for (local_3c = 0; local_3c < nLits; local_3c = local_3c + 1) {
      iVar1 = Abc_Lit2Var(pLits[local_3c]);
      pIVar3 = If_DsdVecObj(&p->vObjs,iVar1);
      if (((Type == 3) && (iVar1 = Abc_LitIsCompl(pLits[local_3c]), iVar1 == 0)) &&
         (iVar1 = If_DsdObjType(pIVar3), iVar1 == 3)) {
        __assert_fail("Type != DAU_DSD_AND || Abc_LitIsCompl(pLits[i]) || If_DsdObjType(pFanin) != DAU_DSD_AND"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x3cc,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
      }
      if ((Type == 4) && (iVar1 = If_DsdObjType(pIVar3), iVar1 == 4)) {
        __assert_fail("Type != DAU_DSD_XOR || If_DsdObjType(pFanin) != DAU_DSD_XOR",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x3cd,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
      }
      if ((local_40 != -1) &&
         (iVar1 = If_DsdObjCompare(p,&p->vObjs,local_40,pLits[local_3c]), 0 < iVar1)) {
        __assert_fail("iPrev == -1 || If_DsdObjCompare(p, &p->vObjs, iPrev, pLits[i]) <= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x3ce,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
      }
      local_40 = pLits[local_3c];
    }
  }
  pIVar3 = If_DsdObjAlloc(p,Type,nLits);
  if (Type == 6) {
    If_DsdObjSetTruth(p,pIVar3,truthId);
  }
  if ((*(uint *)&pIVar3->field_0x4 >> 3 & 0x1f) != 0) {
    __assert_fail("pObj->nSupp == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x3d6,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
  }
  for (local_3c = 0; local_3c < nLits; local_3c = local_3c + 1) {
    (&pIVar3[1].Id)[local_3c] = pLits[local_3c];
    iVar1 = If_DsdVecLitSuppSize(&p->vObjs,pLits[local_3c]);
    *(uint *)&pIVar3->field_0x4 =
         *(uint *)&pIVar3->field_0x4 & 0xffffff07 |
         ((*(uint *)&pIVar3->field_0x4 >> 3 & 0x1f) + iVar1 & 0x1f) << 3;
  }
  if (p->LutSize != 0) {
    iVar1 = Abc_Var2Lit(pIVar3->Id,0);
    uVar2 = If_DsdManCheckXY(p,iVar1,p->LutSize,0,0,0,0);
    if (uVar2 == 0) {
      If_DsdVecObjSetMark(&p->vObjs,pIVar3->Id);
    }
  }
  return pIVar3->Id;
}

Assistant:

int If_DsdObjCreate( If_DsdMan_t * p, int Type, int * pLits, int nLits, int truthId )
{
    If_DsdObj_t * pObj, * pFanin;
    int i, iPrev = -1;
    // check structural canonicity
    assert( Type != DAU_DSD_MUX || nLits == 3 );
//    assert( Type != DAU_DSD_MUX || !Abc_LitIsCompl(pLits[0]) );
    assert( Type != DAU_DSD_MUX || !Abc_LitIsCompl(pLits[1]) || !Abc_LitIsCompl(pLits[2]) );
    // check that leaves are in good order
    if ( Type == DAU_DSD_AND || Type == DAU_DSD_XOR )
    {
        for ( i = 0; i < nLits; i++ )
        {
            pFanin = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(pLits[i]) );
            assert( Type != DAU_DSD_AND || Abc_LitIsCompl(pLits[i]) || If_DsdObjType(pFanin) != DAU_DSD_AND );
            assert( Type != DAU_DSD_XOR || If_DsdObjType(pFanin) != DAU_DSD_XOR );
            assert( iPrev == -1 || If_DsdObjCompare(p, &p->vObjs, iPrev, pLits[i]) <= 0 );
            iPrev = pLits[i];
        }
    }
    // create new node
    pObj = If_DsdObjAlloc( p, Type, nLits );
    if ( Type == DAU_DSD_PRIME )
        If_DsdObjSetTruth( p, pObj, truthId );
    assert( pObj->nSupp == 0 );
    for ( i = 0; i < nLits; i++ )
    {
        pObj->pFans[i] = pLits[i];
        pObj->nSupp += If_DsdVecLitSuppSize(&p->vObjs, pLits[i]);
    }
    // check decomposability
    if ( p->LutSize && !If_DsdManCheckXY(p, Abc_Var2Lit(pObj->Id, 0), p->LutSize, 0, 0, 0, 0) )
        If_DsdVecObjSetMark( &p->vObjs, pObj->Id );
    return pObj->Id;
}